

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevolute.cpp
# Opt level: O2

void __thiscall chrono::ChLinkRevolute::ArchiveOUT(ChLinkRevolute *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChFrame<double>_> local_48;
  ChNameValue<chrono::ChFrame<double>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkRevolute>(marchive);
  ChLink::ArchiveOUT(&this->super_ChLink,marchive);
  local_30._value = &this->m_frame1;
  local_30._name = "m_frame1";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->m_frame2;
  local_48._name = "m_frame2";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChLinkRevolute::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkRevolute>();

    // serialize parent class
    ChLink::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(m_frame1);
    marchive << CHNVP(m_frame2);
}